

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp.c
# Opt level: O2

int comp_method_none_comp
              (LIBSSH2_SESSION *session,uchar *dest,size_t *dest_len,uchar *src,size_t src_len,
              void **abstract)

{
  return 0;
}

Assistant:

static int
comp_method_none_comp(LIBSSH2_SESSION *session,
                      unsigned char *dest,
                      size_t *dest_len,
                      const unsigned char *src,
                      size_t src_len,
                      void **abstract)
{
    (void)session;
    (void)abstract;
    (void)dest;
    (void)dest_len;
    (void)src;
    (void)src_len;

    return 0;
}